

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

void __thiscall mkvmuxer::Tags::~Tags(Tags *this)

{
  int iVar1;
  Tag *pTVar2;
  Tag *this_00;
  Tag *tag;
  Tags *this_local;
  
  while (0 < this->tags_count_) {
    iVar1 = this->tags_count_;
    this->tags_count_ = iVar1 + -1;
    Tag::Clear(this->tags_ + (long)iVar1 + -1);
  }
  pTVar2 = this->tags_;
  if (pTVar2 != (Tag *)0x0) {
    this_00 = pTVar2 + *(long *)&pTVar2[-1].simple_tags_size_;
    while (pTVar2 != this_00) {
      this_00 = this_00 + -1;
      Tag::~Tag(this_00);
    }
    operator_delete__(&pTVar2[-1].simple_tags_size_);
  }
  this->tags_ = (Tag *)0x0;
  return;
}

Assistant:

Tags::~Tags() {
  while (tags_count_ > 0) {
    Tag& tag = tags_[--tags_count_];
    tag.Clear();
  }

  delete[] tags_;
  tags_ = NULL;
}